

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O3

Literals * __thiscall
wasm::Precompute::precomputeValue
          (Literals *__return_storage_ptr__,Precompute *this,Expression *curr)

{
  undefined1 local_68 [8];
  Flow flow;
  
  precomputeExpression((Flow *)local_68,this,curr,false);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = (size_t)local_68;
    Literal::Literal((__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                     (Literal *)&flow);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
              (&(__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible,
               (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  }
  else {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Literals precomputeValue(Expression* curr) {
    // Note that we set replaceExpression to false, as we just care about
    // the value here.
    Flow flow = precomputeExpression(curr, false /* replaceExpression */);
    if (flow.breaking()) {
      return {};
    }
    return flow.values;
  }